

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phrase_test.cpp
# Opt level: O2

void __thiscall
jhu::thrax::PhraseTests_AllConsistentPairsSizeTwo_Test::TestBody
          (PhraseTests_AllConsistentPairsSizeTwo_Test *this)

{
  char *in_RCX;
  char *message;
  string_view sv;
  AssertHelper local_58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  AssertionResult gtest_ar;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> sps;
  Alignment a;
  
  sv._M_str = in_RCX;
  sv._M_len = (size_t)"0-0 1-1";
  readAlignment(&a,(thrax *)0x7,sv);
  minimalConsistentPairs(&sps,&a,2);
  local_58.data_._0_4_ = 3;
  local_50.ptr_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)sps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)sps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>.
              _M_impl.super__Vector_impl_data._M_start >> 3);
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)&gtest_ar,"3","sps.size()",(int *)&local_58,(unsigned_long *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jweese[P]thrax2/test/phrase_test.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_58,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~_Vector_base
            (&sps.super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>);
  std::_Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>::~_Vector_base
            (&a.super__Vector_base<jhu::thrax::Point,_std::allocator<jhu::thrax::Point>_>);
  return;
}

Assistant:

TEST(PhraseTests, AllConsistentPairsSizeTwo) {
  auto a = readAlignment("0-0 1-1");
  auto sps = minimalConsistentPairs(a, 2);
  auto f = sps.front();
  EXPECT_EQ(3, sps.size());
}